

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandLineParser::doParse(CommandLineParser *this)

{
  bool bVar1;
  OptionType OVar2;
  Option *pOVar3;
  long *in_RDI;
  char *in_stack_00000050;
  CommandLineParser *in_stack_00000058;
  SharedOptPtr opt;
  char *curr;
  int posKey;
  bool breakEarly;
  char *in_stack_000000a0;
  CommandLineParser *in_stack_000000a8;
  SharedOptPtr *in_stack_ffffffffffffff78;
  OptionParser *in_stack_ffffffffffffff80;
  CommandLineParser *in_stack_ffffffffffffff88;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff90;
  byte local_61;
  undefined1 local_41 [33];
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_20;
  OptionParser *local_18;
  int local_10;
  byte local_9;
  
  local_9 = 0;
  local_10 = 0;
  while( true ) {
    local_18 = (OptionParser *)(**(code **)(*in_RDI + 0x18))();
    local_61 = 0;
    if (local_18 != (OptionParser *)0x0) {
      local_61 = local_9 ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    OVar2 = getOptionType(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff90 = (vector<const_char_*,_std::allocator<const_char_*>_> *)(ulong)OVar2;
    switch(in_stack_ffffffffffffff90) {
    case (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0:
      bVar1 = handleShortOpt(in_stack_000000a8,in_stack_000000a0);
      if (bVar1) {
        local_18 = (OptionParser *)0x0;
      }
      break;
    case (vector<const_char_*,_std::allocator<const_char_*>_> *)0x1:
      bVar1 = handleLongOpt(in_stack_00000058,in_stack_00000050);
      if (bVar1) {
        local_18 = (OptionParser *)0x0;
      }
      break;
    case (vector<const_char_*,_std::allocator<const_char_*>_> *)0x2:
      local_18 = (OptionParser *)0x0;
      local_9 = 1;
      break;
    case (vector<const_char_*,_std::allocator<const_char_*>_> *)0x3:
      local_10 = local_10 + 1;
      OptionParser::getOption
                (&in_stack_ffffffffffffff88->super_OptionParser,
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(char *)in_stack_ffffffffffffff78);
      pOVar3 = detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::get(&local_20);
      if (pOVar3 != (Option *)0x0) {
        in_stack_ffffffffffffff88 = (CommandLineParser *)local_41;
        in_stack_ffffffffffffff80 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_41 + 1),(char *)in_stack_ffffffffffffff80,
                   (allocator *)in_stack_ffffffffffffff88);
        OptionParser::addOptionValue
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(string *)0x12dacc);
        std::__cxx11::string::~string((string *)(local_41 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_41);
        local_18 = (OptionParser *)0x0;
      }
      detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::~IntrusiveSharedPtr
                ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)in_stack_ffffffffffffff80);
    }
    if (local_18 != (OptionParser *)0x0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
    }
  }
  while (local_18 != (OptionParser *)0x0) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
    local_18 = (OptionParser *)(**(code **)(*in_RDI + 0x18))();
  }
  return;
}

Assistant:

void doParse() {
		bool breakEarly = false;
		int  posKey = 0;
		const char* curr;
		while ((curr = next()) != 0 && !breakEarly) {
			switch (getOptionType(curr)) {
				case short_opt: if (handleShortOpt(curr + 1)) curr = 0; break;
				case long_opt:  if (handleLongOpt(curr + 2))  curr = 0; break;
				case end_opt:   curr = 0; breakEarly = true; break;
				case no_opt: {
					SharedOptPtr opt = getOption(posKey++, curr);
					if (opt.get()) {
						addOptionValue(opt, curr);
						curr = 0;
					}
					break; }
				default:
					assert(0);
			}
			if (curr) {
				remaining.push_back(curr);
			}
		}
		while (curr) {
			remaining.push_back(curr);
			curr = next();
		}
	}